

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

QModelIndex * __thiscall
QFileSystemModel::parent
          (QModelIndex *__return_storage_ptr__,QFileSystemModel *this,QModelIndex *index)

{
  QString *pQVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *pNVar6;
  QString *pQVar7;
  bool bVar8;
  QStringView QVar9;
  
  bVar8 = -1 < (index->c | index->r);
  if ((bVar8) &&
     (lVar3 = *(long *)&this->field_0x8, (index->m).ptr == *(QAbstractItemModel **)(lVar3 + 8))) {
    pQVar1 = (QString *)(lVar3 + 0x138);
    pQVar7 = pQVar1;
    if ((index->m).ptr != (QAbstractItemModel *)0x0) {
      pQVar7 = (QString *)index->i;
    }
    if (!bVar8) {
      pQVar7 = pQVar1;
    }
    pQVar7 = (QString *)pQVar7[2].d.size;
    if (pQVar7 != pQVar1 && pQVar7 != (QString *)0x0) {
      lVar4 = pQVar7[2].d.size;
      pNVar6 = QHashPrivate::
               Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>::
               findNode<QString>(*(Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>
                                   **)(lVar4 + 0x18),pQVar7);
      QVar9.m_data = (pNVar6->value->fileName).d.ptr;
      QVar9.m_size = (pNVar6->value->fileName).d.size;
      uVar5 = QtPrivate::QStringList_indexOf((QList_conflict *)(lVar4 + 0x20),QVar9,0,CaseSensitive)
      ;
      if (*(int *)(lVar3 + 0x1ac) != 0) {
        iVar2 = *(int *)(lVar4 + 0x48);
        if (iVar2 == -1) {
          uVar5 = ~uVar5 + *(int *)(lVar4 + 0x30);
        }
        else if ((int)uVar5 < iVar2) {
          uVar5 = iVar2 + ~uVar5;
        }
      }
      if (uVar5 != 0xffffffff) {
        __return_storage_ptr__->r = uVar5;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->i = (quintptr)pQVar7;
        (__return_storage_ptr__->m).ptr = &this->super_QAbstractItemModel;
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->r = -1;
      __return_storage_ptr__->c = -1;
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QFileSystemModel::parent(const QModelIndex &index) const
{
    Q_D(const QFileSystemModel);
    if (!d->indexValid(index))
        return QModelIndex();

    QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(index);
    Q_ASSERT(indexNode != nullptr);
    QFileSystemModelPrivate::QFileSystemNode *parentNode = indexNode->parent;
    if (parentNode == nullptr || parentNode == &d->root)
        return QModelIndex();

    // get the parent's row
    QFileSystemModelPrivate::QFileSystemNode *grandParentNode = parentNode->parent;
    Q_ASSERT(grandParentNode->children.contains(parentNode->fileName));
    int visualRow = d->translateVisibleLocation(grandParentNode, grandParentNode->visibleLocation(grandParentNode->children.value(parentNode->fileName)->fileName));
    if (visualRow == -1)
        return QModelIndex();
    return createIndex(visualRow, 0, parentNode);
}